

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O1

StructText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeStructText
          (StructText *__return_storage_ptr__,CapnpcCppMain *this,StringPtr scope,StringPtr name,
          StructSchema schema,Array<kj::StringTree> nestedTypeDecls,TemplateContext *templateContext
          )

{
  char *pcVar1;
  ArrayDisposer *pAVar2;
  ArrayDisposer *pAVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  Branch *pBVar9;
  Field field;
  Reader proto_00;
  Reader proto_01;
  StringPtr hexId_00;
  undefined8 uVar10;
  undefined1 auVar11 [8];
  undefined8 uVar12;
  Impl *pIVar13;
  bool bVar14;
  undefined2 uVar15;
  uint i;
  Maybe<capnp::schema::Value::Reader> *pMVar16;
  size_t *firstElement;
  Branch *pBVar17;
  BrandInitializerText *__return_storage_ptr___00;
  BrandInitializerText *pBVar18;
  Impl *pIVar19;
  Schema SVar20;
  Impl *pIVar21;
  ArrayPtr<const_char> *params_1;
  Array<kj::StringTree::Branch> *pAVar22;
  int extraout_EDX;
  int iVar23;
  uint64_t annotationId;
  size_t *psVar24;
  ArrayPtr<const_char> *params;
  ArrayPtr<const_char> *params_00;
  CppTypeName *value;
  CppTypeName *value_00;
  long lVar25;
  size_t sVar26;
  size_t sVar27;
  ElementCount EVar28;
  char *pcVar29;
  unsigned_long i_00;
  CapnpcCppMain *this_00;
  long lVar30;
  StringTree *pSVar31;
  char (*params_2) [6];
  char (*pacVar32) [6];
  StringTree *pSVar33;
  code *brandInitializers_00;
  TemplateContext *templateContext_00;
  size_t sVar34;
  bool bVar35;
  StringPtr scope_00;
  StringPtr name_00;
  StringPtr type;
  StringPtr type_00;
  StringPtr SVar36;
  StringPtr innerName;
  StringPtr fullName_00;
  StringPtr suffix;
  StringPtr suffix_00;
  char (*params_9) [348];
  ArrayPtr<const_char> *pAVar37;
  String *in_stack_fffffffffffff808;
  undefined1 local_7d8 [8];
  undefined1 auStack_7d0 [24];
  Branch *local_7b8;
  Impl *pIStack_7b0;
  ArrayDisposer *local_7a8;
  CapnpcCppMain *local_790;
  String result_1;
  ArrayDisposer *pAStack_770;
  Branch *local_768;
  Impl *pIStack_760;
  ArrayDisposer *local_758;
  ArrayPtr<const_char> local_738;
  StringTree declareText;
  BrandInitializerText brandInitializers;
  char *local_638;
  size_t sStack_630;
  ArrayDisposer *local_628;
  Branch *local_620;
  size_t sStack_618;
  ArrayDisposer *local_610;
  String fullName;
  CppTypeName whichName;
  Array<kj::StringTree> result_7;
  StringTree defineText;
  Array<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText> fieldTexts;
  StructSchema schema_local;
  ArrayPtr<const_char> local_528;
  undefined8 *local_518;
  undefined1 local_510 [24];
  Array<kj::StringTree> result_6;
  Array<kj::StringTree> result_5;
  Array<kj::StringTree> result_4;
  StringPtr scope_local;
  String subScope;
  StringTree local_468;
  Array<kj::StringTree> result_3;
  Array<kj::StringTree> result_2;
  String templates;
  char *local_3c0;
  StringTree local_3b8;
  StringTree local_378;
  char *local_338;
  size_t sStack_330;
  ArrayPtr<const_char> local_328;
  ArrayPtr<const_char> local_318;
  undefined1 local_308 [24];
  undefined8 local_2f0;
  undefined1 local_2e8 [16];
  ArrayPtr<const_char> local_2d8;
  ArrayPtr<const_char> local_2c8;
  undefined1 local_2b8 [24];
  undefined8 local_2a0;
  Reader proto;
  ListReader local_268;
  StringTree local_238;
  StringTree local_200;
  StringTree local_1c8;
  StringTree local_190;
  CappedArray<char,_17UL> hexId;
  ListReader local_138;
  undefined1 local_108 [40];
  BrandInitializerText local_e0;
  
  pIVar13 = pIStack_760;
  pBVar9 = local_768;
  pSVar31 = (StringTree *)name.content.ptr;
  pBVar17 = (Branch *)scope.content.size_;
  scope_local.content.ptr = scope.content.ptr;
  schema_local = schema;
  local_790 = this;
  local_738 = name.content;
  scope_local.content.size_ = (size_t)pBVar17;
  Schema::getProto(&proto,&schema_local.super_Schema);
  proto_00._reader.pointerCount = proto._reader.pointerCount;
  proto_00._reader.dataSize = proto._reader.dataSize;
  proto_00._reader._38_2_ = proto._reader._38_2_;
  proto_00._reader._44_4_ = proto._reader._44_4_;
  proto_00._reader.nestingLimit = proto._reader.nestingLimit;
  pcVar29 = (char *)0xf264a779fef191ce;
  proto_00._reader.capTable = proto._reader.capTable;
  proto_00._reader.segment = proto._reader.segment;
  proto_00._reader.data = proto._reader.data;
  proto_00._reader.pointers = proto._reader.pointers;
  pMVar16 = annotationValue<capnp::schema::Node::Reader>
                      ((Maybe<capnp::schema::Value::Reader> *)&brandInitializers,
                       (CapnpcCppMain *)0xf264a779fef191ce,proto_00,annotationId);
  iVar23 = extraout_EDX;
  if ((char)brandInitializers.scopes.size_ == '\x01') {
    pSVar31 = (StringTree *)
              CONCAT71((int7)((ulong)pSVar31 >> 8),
                       brandInitializers.scopes.branches.size_._4_2_ == 0);
    pMVar16 = (Maybe<capnp::schema::Value::Reader> *)brandInitializers.scopes.text.content.size_;
    pBVar17 = brandInitializers.scopes.branches.ptr;
    pcVar29 = brandInitializers.scopes.text.content.ptr;
    iVar23 = (int)brandInitializers.scopes.branches.disposer;
  }
  if ((char)brandInitializers.scopes.size_ != '\0') {
    if (((ulong)pSVar31 & 1) != 0) {
      iVar23 = 0x7fffffff;
      pMVar16 = (Maybe<capnp::schema::Value::Reader> *)0x0;
      pBVar17 = (Branch *)0x0;
      pcVar29 = (char *)0x0;
    }
    brandInitializers.scopes.size_ = (size_t)pcVar29;
    brandInitializers.scopes.text.content.ptr = (char *)pMVar16;
    brandInitializers.scopes.text.content.size_ = (size_t)pBVar17;
    brandInitializers.scopes.text.content.disposer._0_4_ = iVar23;
    local_738 = (ArrayPtr<const_char>)
                _::PointerReader::getBlob<capnp::Text>
                          ((PointerReader *)&brandInitializers,(void *)0x0,0);
  }
  __return_storage_ptr___00 = &brandInitializers;
  SVar36.content.size_ = 1;
  SVar36.content.ptr = "";
  TemplateContext::args
            (&__return_storage_ptr___00->scopes,(TemplateContext *)nestedTypeDecls.size_,SVar36);
  whichName.name.text.content.ptr = (char *)(scope_local.content.size_ - 1);
  whichName.name.size_ = (size_t)scope_local.content.ptr;
  auStack_7d0._0_8_ = local_738.size_ - 1;
  local_7d8 = (undefined1  [8])local_738.ptr;
  kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
            (&fullName,(_ *)&whichName,(ArrayPtr<const_char> *)local_7d8,
             (ArrayPtr<const_char> *)__return_storage_ptr___00,pSVar31);
  pBVar18 = (BrandInitializerText *)brandInitializers.scopes.branches.size_;
  pBVar17 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                         (int)brandInitializers.scopes.branches.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                        (int)brandInitializers.scopes.branches.disposer),pBVar17,0x40,pBVar18,
               pBVar18,kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    __return_storage_ptr___00 = pBVar18;
  }
  pBVar18 = (BrandInitializerText *)brandInitializers.scopes.text.content.size_;
  pcVar29 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                         (int)brandInitializers.scopes.text.content.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                        (int)brandInitializers.scopes.text.content.disposer),pcVar29,1,pBVar18,
               pBVar18,0);
    __return_storage_ptr___00 = pBVar18;
  }
  kj::str<kj::String&,char_const(&)[3]>
            (&subScope,(kj *)&fullName,(String *)0x229f74,(char (*) [3])__return_storage_ptr___00);
  StructSchema::getFields((FieldList *)&result_1,&schema_local);
  local_7a8 = local_758;
  local_7b8 = local_768;
  pIStack_7b0 = pIStack_760;
  auStack_7d0._8_8_ = result_1.content.disposer;
  auStack_7d0._16_8_ = pAStack_770;
  local_7d8 = (undefined1  [8])result_1.content.ptr;
  auStack_7d0._0_8_ = result_1.content.size_;
  firstElement = (size_t *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0xe0,0,(ulong)local_768 & 0xffffffff,(_func_void_void_ptr *)0x0,
                            (_func_void_void_ptr *)0x0);
  declareText.text.content.size_ = (size_t)(firstElement + ((ulong)local_768 & 0xffffffff) * 0x1c);
  declareText.text.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  psVar24 = firstElement;
  declareText.size_ = (size_t)firstElement;
  declareText.text.content.ptr = (char *)firstElement;
  if ((ListElementCount)local_7b8 != 0) {
    EVar28 = 0;
    do {
      auVar11 = local_7d8;
      _::ListReader::getStructElement
                ((StructReader *)&whichName.name.text.content.size_,(ListReader *)auStack_7d0,EVar28
                );
      whichName.name.size_ = (size_t)auVar11;
      whichName.name.text.content.ptr =
           (char *)CONCAT44(whichName.name.text.content.ptr._4_4_,EVar28);
      pcVar29 = "";
      if (subScope.content.size_ != 0) {
        pcVar29 = subScope.content.ptr;
      }
      scope_00.content.size_ = subScope.content.size_ + (subScope.content.size_ == 0);
      field.proto._reader.pointers._4_4_ = whichName.name.branches.size_._4_4_;
      field.proto._reader.pointers._0_4_ = (undefined4)whichName.name.branches.size_;
      field.proto._reader._36_4_ = whichName.name.branches.disposer._4_4_;
      field.proto._reader.dataSize = whichName.name.branches.disposer._0_4_;
      field.proto._reader._44_4_ = whichName._60_4_;
      field.proto._reader.nestingLimit._0_1_ = whichName.isArgDependent;
      field.proto._reader.nestingLimit._1_1_ = whichName.needsTypename;
      field.proto._reader.nestingLimit._2_1_ = whichName.hasInterfaces_;
      field.proto._reader.nestingLimit._3_1_ = whichName.hasDisambiguatedTemplate_;
      field._8_8_ = whichName.name.text.content.ptr;
      field.parent.super_Schema.raw = (Schema)(Schema)auVar11;
      field.proto._reader.segment = (SegmentReader *)whichName.name.text.content.size_;
      field.proto._reader.capTable = (CapTableReader *)whichName.name.text.content.disposer;
      field.proto._reader.data = whichName.name.branches.ptr;
      scope_00.content.ptr = pcVar29;
      makeFieldText((FieldText *)&brandInitializers,local_790,scope_00,field,
                    (TemplateContext *)nestedTypeDecls.size_);
      *psVar24 = brandInitializers.scopes.size_;
      psVar24[1] = (size_t)brandInitializers.scopes.text.content.ptr;
      psVar24[2] = brandInitializers.scopes.text.content.size_;
      psVar24[3] = CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                            (int)brandInitializers.scopes.text.content.disposer);
      brandInitializers.scopes.text.content.ptr = (char *)0x0;
      brandInitializers.scopes.text.content.size_ = 0;
      psVar24[4] = (size_t)brandInitializers.scopes.branches.ptr;
      psVar24[5] = brandInitializers.scopes.branches.size_;
      psVar24[6] = CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                            (int)brandInitializers.scopes.branches.disposer);
      brandInitializers.scopes.branches.ptr = (Branch *)0x0;
      brandInitializers.scopes.branches.size_ = 0;
      psVar24[7] = brandInitializers.bindings.size_;
      psVar24[8] = (size_t)brandInitializers.bindings.text.content.ptr;
      psVar24[9] = brandInitializers.bindings.text.content.size_;
      psVar24[10] = (size_t)brandInitializers.bindings.text.content.disposer;
      brandInitializers.bindings.text.content.ptr = (char *)0x0;
      brandInitializers.bindings.text.content.size_ = 0;
      psVar24[0xb] = (size_t)brandInitializers.bindings.branches.ptr;
      psVar24[0xc] = brandInitializers.bindings.branches.size_;
      psVar24[0xd] = (size_t)brandInitializers.bindings.branches.disposer;
      brandInitializers.bindings.branches.ptr = (Branch *)0x0;
      brandInitializers.bindings.branches.size_ = 0;
      psVar24[0xe] = brandInitializers.dependencies.size_;
      psVar24[0xf] = (size_t)brandInitializers.dependencies.text.content.ptr;
      psVar24[0x10] = brandInitializers.dependencies.text.content.size_;
      psVar24[0x11] = (size_t)brandInitializers.dependencies.text.content.disposer;
      brandInitializers.dependencies.text.content.ptr = (char *)0x0;
      brandInitializers.dependencies.text.content.size_ = 0;
      psVar24[0x12] = (size_t)brandInitializers.dependencies.branches.ptr;
      psVar24[0x13] = brandInitializers.dependencies.branches.size_;
      psVar24[0x14] = (size_t)brandInitializers.dependencies.branches.disposer;
      brandInitializers.dependencies.branches.ptr = (Branch *)0x0;
      brandInitializers.dependencies.branches.size_ = 0;
      psVar24[0x15] = brandInitializers.dependencyCount;
      psVar24[0x16] = (size_t)local_638;
      psVar24[0x17] = sStack_630;
      psVar24[0x18] = (size_t)local_628;
      local_638 = (char *)0x0;
      sStack_630 = 0;
      psVar24[0x19] = (size_t)local_620;
      psVar24[0x1a] = sStack_618;
      psVar24[0x1b] = (size_t)local_610;
      local_620 = (Branch *)0x0;
      sStack_618 = 0;
      psVar24 = psVar24 + 0x1c;
      FieldText::~FieldText((FieldText *)&brandInitializers);
      EVar28 = EVar28 + 1;
    } while (EVar28 != (ListElementCount)local_7b8);
  }
  lVar25 = (long)psVar24 - (long)firstElement >> 5;
  sVar26 = lVar25 * 0x6db6db6db6db6db7;
  i = 0;
  if (0x11f < proto._reader.dataSize) {
    i = *(uint *)((long)proto._reader.data + 0x20);
  }
  if (proto._reader.dataSize < 0x40) {
    i_00 = 0;
  }
  else {
    i_00 = *proto._reader.data;
  }
  kj::hex(&hexId,i_00);
  TemplateContext::allDecls(&brandInitializers.scopes,(TemplateContext *)nestedTypeDecls.size_);
  kj::_::concat<kj::StringTree>(&templates,&brandInitializers.scopes);
  sVar27 = brandInitializers.scopes.branches.size_;
  pBVar17 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                         (int)brandInitializers.scopes.branches.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                        (int)brandInitializers.scopes.branches.disposer),pBVar17,0x40,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar27 = brandInitializers.scopes.text.content.size_;
  pcVar29 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                         (int)brandInitializers.scopes.text.content.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                        (int)brandInitializers.scopes.text.content.disposer),pcVar29,1,sVar27,sVar27
               ,0);
  }
  if (proto._reader.dataSize < 0x80) {
    uVar15 = 0;
  }
  else {
    uVar15 = *(undefined2 *)((long)proto._reader.data + 0xe);
  }
  brandInitializers.scopes.size_ = CONCAT62(brandInitializers.scopes.size_._2_6_,uVar15);
  if (proto._reader.dataSize < 0xd0) {
    uVar15 = 0;
  }
  else {
    uVar15 = *(undefined2 *)((long)proto._reader.data + 0x18);
  }
  whichName.name.size_ = CONCAT62(whichName.name.size_._2_6_,uVar15);
  kj::
  strTree<char_const(&)[58],kj::CappedArray<char,17ul>&,char_const(&)[3],unsigned_short,char_const(&)[3],unsigned_short,char_const(&)[3]>
            (&declareText,(kj *)"  struct _capnpPrivate {\n    CAPNP_DECLARE_STRUCT_HEADER(",
             (char (*) [58])&hexId,(CappedArray<char,_17UL> *)0x22b13e,
             (char (*) [3])&brandInitializers,(unsigned_short *)0x22b13e,(char (*) [3])&whichName,
             (unsigned_short *)")\n",(char (*) [3])in_stack_fffffffffffff808);
  pcVar29 = "constexpr uint16_t ";
  pIVar19 = (Impl *)0x22a50e;
  kj::
  strTree<char_const(&)[4],kj::String&,char_const(&)[2],kj::String&,char_const(&)[20],kj::String&,char_const(&)[32],kj::String&,char_const(&)[20],kj::String&,char_const(&)[48],kj::String&,char_const(&)[25],kj::String&,char_const(&)[24],kj::String&,char_const(&)[40],kj::String&,char_const(&)[26]>
            (&defineText,(kj *)"// ",(char (*) [4])&fullName,(String *)0x22a50e,
             (char (*) [2])&templates,(String *)"constexpr uint16_t ",(char (*) [20])&fullName,
             (String *)"::_capnpPrivate::dataWordSize;\n",(char (*) [32])&templates,
             (String *)"constexpr uint16_t ",(char (*) [20])&fullName,
             (String *)"::_capnpPrivate::pointerCount;\n#if !CAPNP_LITE\n",(char (*) [48])&templates
             ,(String *)"constexpr ::capnp::Kind ",(char (*) [25])&fullName,
             (String *)"::_capnpPrivate::kind;\n",(char (*) [24])&templates,
             (String *)"constexpr ::capnp::_::RawSchema const* ",(char (*) [40])&fullName,
             (String *)"::_capnpPrivate::schema;\n",(char (*) [26])in_stack_fffffffffffff808);
  if ((*(uint *)(nestedTypeDecls.size_ + 0x38) < 0x121) ||
     ((*(byte *)(*(long *)(nestedTypeDecls.size_ + 0x28) + 0x24) & 1) == 0)) {
    whichName.name.size_ = (size_t)anon_var_dwarf_81f06;
    whichName.name.text.content.ptr = (char *)0x92;
    kj::StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>>
              (&brandInitializers.scopes,&declareText,&whichName.name,
               (ArrayPtr<const_char> *)pIVar19);
    pIVar21 = (Impl *)declareText.text.content.size_;
    pcVar29 = declareText.text.content.ptr;
    declareText.size_ = brandInitializers.scopes.size_;
    if (declareText.text.content.ptr != (char *)0x0) {
      declareText.text.content.ptr = (char *)0x0;
      declareText.text.content.size_ = 0;
      (**(declareText.text.content.disposer)->_vptr_ArrayDisposer)
                (declareText.text.content.disposer,pcVar29,1,pIVar21,pIVar21,0);
      pIVar19 = pIVar21;
    }
    pIVar21 = (Impl *)declareText.branches.size_;
    pBVar17 = declareText.branches.ptr;
    declareText.text.content.ptr = brandInitializers.scopes.text.content.ptr;
    declareText.text.content.size_ = brandInitializers.scopes.text.content.size_;
    declareText.text.content.disposer =
         (ArrayDisposer *)
         CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                  (int)brandInitializers.scopes.text.content.disposer);
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    if (declareText.branches.ptr != (Branch *)0x0) {
      declareText.branches.ptr = (Branch *)0x0;
      declareText.branches.size_ = 0;
      (**(declareText.branches.disposer)->_vptr_ArrayDisposer)
                (declareText.branches.disposer,pBVar17,0x40,pIVar21,pIVar21,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      pIVar19 = pIVar21;
    }
    pIVar21 = (Impl *)brandInitializers.scopes.text.content.size_;
    pcVar29 = brandInitializers.scopes.text.content.ptr;
    declareText.branches.ptr = brandInitializers.scopes.branches.ptr;
    declareText.branches.disposer =
         (ArrayDisposer *)
         CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                  (int)brandInitializers.scopes.branches.disposer);
    declareText.branches.size_ = brandInitializers.scopes.branches.size_;
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
      brandInitializers.scopes.text.content.ptr = (char *)0x0;
      brandInitializers.scopes.text.content.size_ = 0;
      (*(code *)**(undefined8 **)
                  CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                           (int)brandInitializers.scopes.text.content.disposer))
                ((undefined8 *)
                 CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                          (int)brandInitializers.scopes.text.content.disposer),pcVar29,1,pIVar21,
                 pIVar21,0);
      pIVar19 = pIVar21;
    }
  }
  else {
    SVar20 = schema_local.super_Schema.raw;
    makeBrandInitializers
              (&brandInitializers,local_790,(TemplateContext *)nestedTypeDecls.size_,
               schema_local.super_Schema.raw);
    makeGenericDeclarations
              ((StringTree *)local_7d8,(CapnpcCppMain *)nestedTypeDecls.size_,
               (TemplateContext *)(ulong)(brandInitializers.dependencies.size_ != 0),
               SUB81(SVar20.raw,0));
    kj::strTree<kj::StringTree,char_const(&)[21],kj::StringTree,char_const(&)[28]>
              (&whichName.name,(kj *)&declareText,(StringTree *)"    #if !CAPNP_LITE\n",
               (char (*) [21])local_7d8,(StringTree *)0x22a36d,(char (*) [28])pcVar29);
    sVar27 = declareText.text.content.size_;
    pcVar4 = declareText.text.content.ptr;
    declareText.size_ = whichName.name.size_;
    brandInitializers_00 = (code *)pcVar29;
    if (declareText.text.content.ptr != (char *)0x0) {
      declareText.text.content.ptr = (char *)0x0;
      declareText.text.content.size_ = 0;
      brandInitializers_00 = (code *)0x0;
      (**(declareText.text.content.disposer)->_vptr_ArrayDisposer)
                (declareText.text.content.disposer,pcVar4,1,sVar27,sVar27);
    }
    sVar27 = declareText.branches.size_;
    pBVar17 = declareText.branches.ptr;
    declareText.text.content.ptr = whichName.name.text.content.ptr;
    declareText.text.content.size_ = whichName.name.text.content.size_;
    declareText.text.content.disposer = whichName.name.text.content.disposer;
    whichName.name.text.content.ptr = (char *)0x0;
    whichName.name.text.content.size_ = 0;
    if (declareText.branches.ptr != (Branch *)0x0) {
      declareText.branches.ptr = (Branch *)0x0;
      declareText.branches.size_ = 0;
      brandInitializers_00 = kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct;
      (**(declareText.branches.disposer)->_vptr_ArrayDisposer)
                (declareText.branches.disposer,pBVar17,0x40,sVar27,sVar27);
    }
    sVar27 = whichName.name.text.content.size_;
    pcVar29 = whichName.name.text.content.ptr;
    declareText.branches.ptr = whichName.name.branches.ptr;
    declareText.branches.size_ =
         CONCAT44(whichName.name.branches.size_._4_4_,(undefined4)whichName.name.branches.size_);
    declareText.branches.disposer =
         (ArrayDisposer *)
         CONCAT44(whichName.name.branches.disposer._4_4_,whichName.name.branches.disposer._0_4_);
    whichName.name.branches.ptr = (Branch *)0x0;
    whichName.name.branches.size_._0_4_ = 0;
    whichName.name.branches.size_._4_4_ = 0;
    if (whichName.name.text.content.ptr != (char *)0x0) {
      whichName.name.text.content.ptr = (char *)0x0;
      whichName.name.text.content.size_ = 0;
      brandInitializers_00 = (code *)0x0;
      (**(whichName.name.text.content.disposer)->_vptr_ArrayDisposer)
                (whichName.name.text.content.disposer,pcVar29,1,sVar27,sVar27);
    }
    pIVar19 = pIStack_7b0;
    pBVar17 = local_7b8;
    if (local_7b8 != (Branch *)0x0) {
      local_7b8 = (Branch *)0x0;
      pIStack_7b0 = (Impl *)0x0;
      brandInitializers_00 = kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct;
      (**local_7a8->_vptr_ArrayDisposer)(local_7a8,pBVar17,0x40,pIVar19,pIVar19);
    }
    uVar12 = auStack_7d0._8_8_;
    uVar10 = auStack_7d0._0_8_;
    if ((SegmentReader *)auStack_7d0._0_8_ != (SegmentReader *)0x0) {
      auStack_7d0._0_8_ = (SegmentReader *)0x0;
      auStack_7d0._8_8_ = (StringTree *)0x0;
      brandInitializers_00 = (code *)0x0;
      (***(_func_int ***)auStack_7d0._16_8_)(auStack_7d0._16_8_,uVar10,1,uVar12,uVar12);
    }
    templateContext_00 = (TemplateContext *)fullName.content.ptr;
    if (fullName.content.size_ == 0) {
      templateContext_00 = (TemplateContext *)0x22a50f;
    }
    pIVar19 = (Impl *)(fullName.content.size_ + (fullName.content.size_ == 0));
    kj::heapString(&result_1,hexId.currentSize);
    if (hexId.currentSize != 0) {
      pcVar29 = (char *)result_1.content.size_;
      if (result_1.content.size_ != 0) {
        pcVar29 = result_1.content.ptr;
      }
      memcpy(pcVar29,hexId.content,hexId.currentSize);
    }
    local_338 = result_1.content.ptr;
    if (result_1.content.size_ == 0) {
      local_338 = "";
    }
    sStack_330 = result_1.content.size_ + (result_1.content.size_ == 0);
    local_e0.scopes.text.content.disposer =
         (ArrayDisposer *)
         CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                  (int)brandInitializers.scopes.text.content.disposer);
    local_e0.scopes.size_ = brandInitializers.scopes.size_;
    local_e0.scopes.text.content.ptr = brandInitializers.scopes.text.content.ptr;
    local_e0.scopes.text.content.size_ = brandInitializers.scopes.text.content.size_;
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    local_e0.scopes.branches.ptr = brandInitializers.scopes.branches.ptr;
    local_e0.scopes.branches.size_ = brandInitializers.scopes.branches.size_;
    local_e0.bindings.size_ = brandInitializers.bindings.size_;
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    local_e0.bindings.text.content.ptr = brandInitializers.bindings.text.content.ptr;
    local_e0.bindings.text.content.size_ = brandInitializers.bindings.text.content.size_;
    local_e0.bindings.text.content.disposer = brandInitializers.bindings.text.content.disposer;
    brandInitializers.bindings.text.content.ptr = (char *)0x0;
    brandInitializers.bindings.text.content.size_ = 0;
    local_e0.bindings.branches.ptr = brandInitializers.bindings.branches.ptr;
    local_e0.bindings.branches.size_ = brandInitializers.bindings.branches.size_;
    local_e0.bindings.branches.disposer = brandInitializers.bindings.branches.disposer;
    brandInitializers.bindings.branches.ptr = (Branch *)0x0;
    brandInitializers.bindings.branches.size_ = 0;
    local_e0.dependencies.size_ = brandInitializers.dependencies.size_;
    local_e0.dependencies.text.content.ptr = brandInitializers.dependencies.text.content.ptr;
    local_e0.dependencies.text.content.size_ = brandInitializers.dependencies.text.content.size_;
    local_e0.dependencies.text.content.disposer =
         brandInitializers.dependencies.text.content.disposer;
    brandInitializers.dependencies.text.content.ptr = (char *)0x0;
    brandInitializers.dependencies.text.content.size_ = 0;
    local_e0.dependencies.branches.ptr = brandInitializers.dependencies.branches.ptr;
    local_e0.dependencies.branches.size_ = brandInitializers.dependencies.branches.size_;
    local_e0.dependencies.branches.disposer = brandInitializers.dependencies.branches.disposer;
    brandInitializers.dependencies.branches.ptr = (Branch *)0x0;
    brandInitializers.dependencies.branches.size_ = 0;
    local_e0.dependencyCount = brandInitializers.dependencyCount;
    hexId_00.content.size_ = sStack_330;
    hexId_00.content.ptr = local_338;
    fullName_00.content.size_ = (size_t)&local_e0;
    fullName_00.content.ptr = (char *)pIVar19;
    makeGenericDefinitions
              ((StringTree *)local_7d8,(CapnpcCppMain *)nestedTypeDecls.size_,templateContext_00,
               fullName_00,hexId_00,(BrandInitializerText *)brandInitializers_00);
    kj::StringTree::concat<kj::StringTree,kj::StringTree>
              (&whichName.name,&defineText,(StringTree *)local_7d8,(StringTree *)pIVar19);
    pIVar21 = (Impl *)defineText.text.content.size_;
    pcVar29 = defineText.text.content.ptr;
    defineText.size_ = whichName.name.size_;
    if (defineText.text.content.ptr != (char *)0x0) {
      defineText.text.content.ptr = (char *)0x0;
      defineText.text.content.size_ = 0;
      (*(code *)**(undefined8 **)
                  CONCAT44(defineText.text.content.disposer._4_4_,
                           (int)defineText.text.content.disposer))
                ((undefined8 *)
                 CONCAT44(defineText.text.content.disposer._4_4_,
                          (int)defineText.text.content.disposer),pcVar29,1,pIVar21,pIVar21,0);
      pIVar19 = pIVar21;
    }
    pIVar21 = (Impl *)defineText.branches.size_;
    pBVar17 = defineText.branches.ptr;
    defineText.text.content.ptr = whichName.name.text.content.ptr;
    defineText.text.content.size_ = whichName.name.text.content.size_;
    defineText.text.content.disposer._0_4_ = whichName.name.text.content.disposer._0_4_;
    defineText.text.content.disposer._4_4_ = whichName.name.text.content.disposer._4_4_;
    whichName.name.text.content.ptr = (char *)0x0;
    whichName.name.text.content.size_ = 0;
    if (defineText.branches.ptr != (Branch *)0x0) {
      defineText.branches.ptr = (Branch *)0x0;
      defineText.branches.size_ = 0;
      (**(defineText.branches.disposer)->_vptr_ArrayDisposer)
                (defineText.branches.disposer,pBVar17,0x40,pIVar21,pIVar21,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      pIVar19 = pIVar21;
    }
    pIVar21 = (Impl *)whichName.name.text.content.size_;
    pcVar29 = whichName.name.text.content.ptr;
    defineText.branches.ptr = whichName.name.branches.ptr;
    defineText.branches.size_ =
         CONCAT44(whichName.name.branches.size_._4_4_,(undefined4)whichName.name.branches.size_);
    defineText.branches.disposer =
         (ArrayDisposer *)
         CONCAT44(whichName.name.branches.disposer._4_4_,whichName.name.branches.disposer._0_4_);
    whichName.name.branches.ptr = (Branch *)0x0;
    whichName.name.branches.size_._0_4_ = 0;
    whichName.name.branches.size_._4_4_ = 0;
    if (whichName.name.text.content.ptr != (char *)0x0) {
      whichName.name.text.content.ptr = (char *)0x0;
      whichName.name.text.content.size_ = 0;
      (**(whichName.name.text.content.disposer)->_vptr_ArrayDisposer)
                (whichName.name.text.content.disposer,pcVar29,1,pIVar21,pIVar21,0);
      pIVar19 = pIVar21;
    }
    pIVar21 = pIStack_7b0;
    pBVar17 = local_7b8;
    if (local_7b8 != (Branch *)0x0) {
      local_7b8 = (Branch *)0x0;
      pIStack_7b0 = (Impl *)0x0;
      (**local_7a8->_vptr_ArrayDisposer)
                (local_7a8,pBVar17,0x40,pIVar21,pIVar21,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      pIVar19 = pIVar21;
    }
    pIVar21 = (Impl *)auStack_7d0._8_8_;
    uVar10 = auStack_7d0._0_8_;
    if ((SegmentReader *)auStack_7d0._0_8_ != (SegmentReader *)0x0) {
      auStack_7d0._0_8_ = (SegmentReader *)0x0;
      auStack_7d0._8_8_ = (StringTree *)0x0;
      (***(_func_int ***)auStack_7d0._16_8_)(auStack_7d0._16_8_,uVar10,1,pIVar21,pIVar21,0);
      pIVar19 = pIVar21;
    }
    BrandInitializerText::~BrandInitializerText(&local_e0);
    pIVar21 = (Impl *)result_1.content.size_;
    pcVar29 = result_1.content.ptr;
    if (result_1.content.ptr != (char *)0x0) {
      result_1.content.ptr = (char *)0x0;
      result_1.content.size_ = 0;
      (**(result_1.content.disposer)->_vptr_ArrayDisposer)
                (result_1.content.disposer,pcVar29,1,pIVar21,pIVar21,0);
      pIVar19 = pIVar21;
    }
    BrandInitializerText::~BrandInitializerText(&brandInitializers);
  }
  whichName.name.size_ = (size_t)anon_var_dwarf_81f1e;
  whichName.name.text.content.ptr = (char *)0x4;
  kj::StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>>
            (&brandInitializers.scopes,&declareText,&whichName.name,(ArrayPtr<const_char> *)pIVar19)
  ;
  pAVar37 = (ArrayPtr<const_char> *)declareText.text.content.size_;
  pcVar29 = declareText.text.content.ptr;
  declareText.size_ = brandInitializers.scopes.size_;
  params_1 = (ArrayPtr<const_char> *)&declareText.text;
  if (declareText.text.content.ptr != (char *)0x0) {
    declareText.text.content.ptr = (char *)0x0;
    declareText.text.content.size_ = 0;
    (**(declareText.text.content.disposer)->_vptr_ArrayDisposer)
              (declareText.text.content.disposer,pcVar29,1,pAVar37,pAVar37,0);
    params_1 = pAVar37;
  }
  pAVar37 = (ArrayPtr<const_char> *)declareText.branches.size_;
  pBVar17 = declareText.branches.ptr;
  declareText.text.content.ptr = brandInitializers.scopes.text.content.ptr;
  declareText.text.content.size_ = brandInitializers.scopes.text.content.size_;
  declareText.text.content.disposer =
       (ArrayDisposer *)
       CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                (int)brandInitializers.scopes.text.content.disposer);
  brandInitializers.scopes.text.content.ptr = (char *)0x0;
  brandInitializers.scopes.text.content.size_ = 0;
  if (declareText.branches.ptr != (Branch *)0x0) {
    declareText.branches.ptr = (Branch *)0x0;
    declareText.branches.size_ = 0;
    (**(declareText.branches.disposer)->_vptr_ArrayDisposer)
              (declareText.branches.disposer,pBVar17,0x40,pAVar37,pAVar37,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    params_1 = pAVar37;
  }
  pAVar37 = (ArrayPtr<const_char> *)brandInitializers.scopes.text.content.size_;
  pcVar29 = brandInitializers.scopes.text.content.ptr;
  declareText.branches.ptr = brandInitializers.scopes.branches.ptr;
  declareText.branches.disposer =
       (ArrayDisposer *)
       CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                (int)brandInitializers.scopes.branches.disposer);
  declareText.branches.size_ = brandInitializers.scopes.branches.size_;
  brandInitializers.scopes.branches.ptr = (Branch *)0x0;
  brandInitializers.scopes.branches.size_ = 0;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                         (int)brandInitializers.scopes.text.content.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                        (int)brandInitializers.scopes.text.content.disposer),pcVar29,1,pAVar37,
               pAVar37,0);
    params_1 = pAVar37;
  }
  whichName.name.size_ = (long)"();\n#endif  // !CAPNP_LITE\n\n" + 4;
  whichName.name.text.content.ptr = &DAT_00000018;
  kj::StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>>
            (&brandInitializers.scopes,&defineText,&whichName.name,params_1);
  sVar27 = defineText.text.content.size_;
  pcVar29 = defineText.text.content.ptr;
  defineText.size_ = brandInitializers.scopes.size_;
  if (defineText.text.content.ptr != (char *)0x0) {
    defineText.text.content.ptr = (char *)0x0;
    defineText.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(defineText.text.content.disposer._4_4_,
                         (int)defineText.text.content.disposer))
              ((undefined8 *)
               CONCAT44(defineText.text.content.disposer._4_4_,(int)defineText.text.content.disposer
                       ),pcVar29,1,sVar27,sVar27,0);
  }
  sVar27 = defineText.branches.size_;
  pBVar17 = defineText.branches.ptr;
  defineText.text.content.ptr = brandInitializers.scopes.text.content.ptr;
  defineText.text.content.size_ = brandInitializers.scopes.text.content.size_;
  defineText.text.content.disposer._0_4_ = (int)brandInitializers.scopes.text.content.disposer;
  defineText.text.content.disposer._4_4_ = brandInitializers.scopes.text.content.disposer._4_4_;
  brandInitializers.scopes.text.content.ptr = (char *)0x0;
  brandInitializers.scopes.text.content.size_ = 0;
  if (defineText.branches.ptr != (Branch *)0x0) {
    defineText.branches.ptr = (Branch *)0x0;
    defineText.branches.size_ = 0;
    (**(defineText.branches.disposer)->_vptr_ArrayDisposer)
              (defineText.branches.disposer,pBVar17,0x40,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar27 = brandInitializers.scopes.text.content.size_;
  pcVar29 = brandInitializers.scopes.text.content.ptr;
  defineText.branches.ptr = brandInitializers.scopes.branches.ptr;
  defineText.branches.disposer =
       (ArrayDisposer *)
       CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                (int)brandInitializers.scopes.branches.disposer);
  defineText.branches.size_ = brandInitializers.scopes.branches.size_;
  brandInitializers.scopes.branches.ptr = (Branch *)0x0;
  brandInitializers.scopes.branches.size_ = 0;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                         (int)brandInitializers.scopes.text.content.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                        (int)brandInitializers.scopes.text.content.disposer),pcVar29,1,sVar27,sVar27
               ,0);
  }
  whichName.name.branches.disposer._0_4_ = 0;
  whichName.name.branches.disposer._4_4_ = 0;
  whichName.isArgDependent = false;
  whichName.needsTypename = false;
  whichName.hasInterfaces_ = false;
  whichName.hasDisambiguatedTemplate_ = false;
  whichName.name.branches.ptr = (Branch *)0x0;
  whichName.name.branches.size_._0_4_ = 0;
  whichName.name.branches.size_._4_4_ = 0;
  whichName.name.text.content.size_ = 0;
  whichName.name.text.content.disposer = (ArrayDisposer *)0x0;
  whichName.name.size_ = 0;
  whichName.name.text.content.ptr = (char *)0x0;
  if ((0xff < proto._reader.dataSize) && (*(short *)((long)proto._reader.data + 0x1e) != 0)) {
    brandInitializers.scopes.size_ = brandInitializers.scopes.size_ & 0xffffffffffffff00;
    cppFullName((CppTypeName *)local_7d8,local_790,schema_local.super_Schema.raw,
                schema_local.super_Schema.raw,
                (Maybe<capnp::InterfaceSchema::Method> *)&brandInitializers);
    CppTypeName::operator=(&whichName,(CppTypeName *)local_7d8);
    pIVar19 = pIStack_7b0;
    pBVar17 = local_7b8;
    if (local_7b8 != (Branch *)0x0) {
      local_7b8 = (Branch *)0x0;
      pIStack_7b0 = (Impl *)0x0;
      (**local_7a8->_vptr_ArrayDisposer)
                (local_7a8,pBVar17,0x40,pIVar19,pIVar19,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    uVar12 = auStack_7d0._8_8_;
    uVar10 = auStack_7d0._0_8_;
    if ((SegmentReader *)auStack_7d0._0_8_ != (SegmentReader *)0x0) {
      auStack_7d0._0_8_ = (SegmentReader *)0x0;
      auStack_7d0._8_8_ = (StringTree *)0x0;
      (***(_func_int ***)auStack_7d0._16_8_)(auStack_7d0._16_8_,uVar10,1,uVar12,uVar12,0);
    }
    innerName.content.size_ = 6;
    innerName.content.ptr = "Which";
    CppTypeName::addMemberType(&whichName,innerName);
  }
  bVar14 = TemplateContext::hasParams((TemplateContext *)nestedTypeDecls.size_);
  local_3c0 = "";
  if (bVar14) {
    local_3c0 = "  ";
  }
  suffix.content.size_ = 1;
  suffix.content.ptr = "";
  TemplateContext::decl(&local_190,(TemplateContext *)nestedTypeDecls.size_,true,suffix);
  kj::strTree<char_const*,kj::StringTree,char_const(&)[10],kj::StringPtr&,char_const(&)[3]>
            (&__return_storage_ptr__->outerTypeDecl,(kj *)&local_3c0,(char **)&local_190,
             (StringTree *)"  struct ",(char (*) [10])&local_738,(StringPtr *)0x22b124,
             (char (*) [3])in_stack_fffffffffffff808);
  TemplateContext::parentDecls(&local_1c8,(TemplateContext *)nestedTypeDecls.size_);
  local_790 = (CapnpcCppMain *)0x22a50f;
  suffix_00.content.size_ = 1;
  suffix_00.content.ptr = "";
  TemplateContext::decl
            (&local_200,(TemplateContext *)nestedTypeDecls.size_,scope_local.content.size_ < 2,
             suffix_00);
  if (proto._reader.dataSize < 0x100) {
    bVar14 = false;
  }
  else {
    bVar14 = *(short *)((long)proto._reader.data + 0x1e) != 0;
  }
  if (bVar14) {
    if (proto._reader.pointerCount < 4) {
      proto._reader.nestingLimit = 0x7fffffff;
      proto._reader.capTable = (CapTableReader *)0x0;
      brandInitializers.scopes.text.content.size_ = 0;
      proto._reader.segment = (SegmentReader *)0x0;
    }
    else {
      brandInitializers.scopes.text.content.size_ = (size_t)(proto._reader.pointers + 3);
    }
    brandInitializers.scopes.size_ = (size_t)proto._reader.segment;
    brandInitializers.scopes.text.content.ptr = (char *)proto._reader.capTable;
    brandInitializers.scopes.text.content.disposer._0_4_ = proto._reader.nestingLimit;
    _::PointerReader::getList
              (&local_138,(PointerReader *)&brandInitializers,INLINE_COMPOSITE,(word *)0x0);
    local_268.ptr = local_138.ptr;
    local_268.elementCount = local_138.elementCount;
    local_268.step = local_138.step;
    local_268.segment = local_138.segment;
    local_268.capTable = local_138.capTable;
    local_268.structDataSize = local_138.structDataSize;
    local_268.structPointerCount = local_138.structPointerCount;
    local_268.elementSize = local_138.elementSize;
    local_268._39_1_ = local_138._39_1_;
    local_268.nestingLimit = local_138.nestingLimit;
    local_268._44_4_ = local_138._44_4_;
    params_2 = (char (*) [6])0x0;
    result_1.content.ptr =
         (char *)kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,local_138._24_8_ & 0xffffffff,(_func_void_void_ptr *)0x0,
                            (_func_void_void_ptr *)0x0);
    pAVar22 = (Array<kj::StringTree::Branch> *)
              (result_1.content.ptr + (local_138._24_8_ & 0xffffffff) * 0x38);
    pAStack_770 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    result_1.content.size_ = (size_t)result_1.content.ptr;
    result_1.content.disposer = (ArrayDisposer *)pAVar22;
    if (local_268.elementCount != 0) {
      EVar28 = 0;
      pcVar29 = brandInitializers.scopes.text.content.ptr;
      sVar27 = brandInitializers.scopes.text.content.size_;
      pBVar17 = brandInitializers.scopes.branches.ptr;
      sVar34 = brandInitializers.scopes.branches.size_;
      do {
        brandInitializers.scopes.branches.size_ = sVar34;
        brandInitializers.scopes.branches.ptr = pBVar17;
        brandInitializers.scopes.text.content.size_ = sVar27;
        brandInitializers.scopes.text.content.ptr = pcVar29;
        this_00 = (CapnpcCppMain *)local_7d8;
        _::ListReader::getStructElement((StructReader *)local_7d8,&local_268,EVar28);
        if (((ListElementCount)local_7b8 < 0x20) ||
           (*(short *)((long)&((Maybe<kj::_::Mutex::Waiter_&> *)auStack_7d0._8_8_)->ptr + 2) == 0))
        {
          kj::StringTree::concat<>();
        }
        else {
          proto_01._reader.capTable = (CapTableReader *)auStack_7d0._0_8_;
          proto_01._reader.segment = (SegmentReader *)local_7d8;
          proto_01._reader.data = (void *)auStack_7d0._8_8_;
          proto_01._reader.pointers = (WirePointer *)auStack_7d0._16_8_;
          proto_01._reader._32_8_ = local_7b8;
          proto_01._reader._40_8_ = pIStack_7b0;
          SVar36 = protoName<capnp::schema::Field::Reader>(this_00,proto_01);
          name_00.content.ptr = (char *)SVar36.content.size_;
          name_00.content.size_ = (size_t)pAVar22;
          toUpperCase((String *)&local_378,(CapnpcCppMain *)SVar36.content.ptr,name_00);
          kj::strTree<char_const(&)[5],kj::String,char_const(&)[3]>
                    (&brandInitializers.scopes,(kj *)0x23ba08,(char (*) [5])&local_378,
                     (String *)0x22b2b8,(char (*) [3])params_2);
          pacVar32 = (char (*) [6])local_378.text.content.ptr;
          sVar27 = local_378.size_;
          if (local_378.size_ != 0) {
            local_378.size_ = 0;
            local_378.text.content.ptr = (char *)0x0;
            (*(code *)**(undefined8 **)local_378.text.content.size_)
                      (local_378.text.content.size_,sVar27,1,pacVar32,pacVar32,0);
            params_2 = pacVar32;
          }
        }
        *(size_t *)result_1.content.size_ = brandInitializers.scopes.size_;
        *(char **)(result_1.content.size_ + 8) = brandInitializers.scopes.text.content.ptr;
        *(size_t *)(result_1.content.size_ + 0x10) = brandInitializers.scopes.text.content.size_;
        *(ulong *)(result_1.content.size_ + 0x18) =
             CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                      (int)brandInitializers.scopes.text.content.disposer);
        brandInitializers.scopes.text.content.ptr = (char *)0x0;
        pcVar29 = brandInitializers.scopes.text.content.ptr;
        brandInitializers.scopes.text.content.size_ = 0;
        sVar27 = brandInitializers.scopes.text.content.size_;
        *(Branch **)(result_1.content.size_ + 0x20) = brandInitializers.scopes.branches.ptr;
        *(size_t *)(result_1.content.size_ + 0x28) = brandInitializers.scopes.branches.size_;
        *(ulong *)(result_1.content.size_ + 0x30) =
             CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                      (int)brandInitializers.scopes.branches.disposer);
        pAVar22 = &brandInitializers.scopes.branches;
        brandInitializers.scopes.branches.ptr = (Branch *)0x0;
        pBVar17 = brandInitializers.scopes.branches.ptr;
        brandInitializers.scopes.branches.size_ = 0;
        sVar34 = brandInitializers.scopes.branches.size_;
        result_1.content.size_ = result_1.content.size_ + 0x38;
        brandInitializers.scopes.branches.size_ = 0;
        brandInitializers.scopes.branches.ptr = (Branch *)0x0;
        brandInitializers.scopes.text.content.size_ = 0;
        brandInitializers.scopes.text.content.ptr = (char *)0x0;
        EVar28 = EVar28 + 1;
      } while (EVar28 != local_268.elementCount);
    }
    result_2.size_ =
         ((long)(result_1.content.size_ - (long)result_1.content.ptr) >> 3) * 0x6db6db6db6db6db7;
    result_2.ptr = (StringTree *)result_1.content.ptr;
    result_2.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    kj::strTree<char_const(&)[26],kj::Array<kj::StringTree>,char_const(&)[6]>
              (&local_238,(kj *)"  enum Which: uint16_t {\n",(char (*) [26])&result_2,
               (Array<kj::StringTree> *)"  };\n",params_2);
  }
  else {
    kj::StringTree::concat<>();
  }
  result_3.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,(size_t)((nestedTypeDecls.ptr)->text).content.ptr,
                            (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar31 = result_3.ptr;
  if (((nestedTypeDecls.ptr)->text).content.ptr != (char *)0x0) {
    psVar24 = (size_t *)(nestedTypeDecls.ptr)->size_;
    do {
      pcVar29 = (char *)psVar24[1];
      sVar27 = psVar24[2];
      pAVar3 = (ArrayDisposer *)psVar24[3];
      pBVar17 = (Branch *)psVar24[4];
      sVar34 = psVar24[5];
      psVar24[1] = 0;
      psVar24[2] = 0;
      pAVar2 = (ArrayDisposer *)psVar24[6];
      psVar24[4] = 0;
      psVar24[5] = 0;
      pSVar31->size_ = *psVar24;
      (pSVar31->text).content.ptr = pcVar29;
      (pSVar31->text).content.size_ = sVar27;
      (pSVar31->text).content.disposer = pAVar3;
      (pSVar31->branches).ptr = pBVar17;
      (pSVar31->branches).size_ = sVar34;
      (pSVar31->branches).disposer = pAVar2;
      pSVar31 = pSVar31 + 1;
      psVar24 = psVar24 + 7;
    } while (psVar24 !=
             (size_t *)
             ((long)((nestedTypeDecls.ptr)->text).content.ptr * 0x38 + (nestedTypeDecls.ptr)->size_)
            );
  }
  result_3.size_ = ((long)pSVar31 - (long)result_3.ptr >> 3) * 0x6db6db6db6db6db7;
  result_3.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  kj::
  strTree<kj::StringTree,kj::StringTree,char_const(&)[8],kj::StringPtr&,kj::StringPtr&,char_const(&)[4],char_const(&)[3],kj::StringPtr&,char_const(&)[66],kj::StringTree,kj::Array<kj::StringTree>,char_const(&)[2],kj::StringTree,char_const(&)[2],char_const(&)[5]>
            (&__return_storage_ptr__->outerTypeDef,(kj *)&local_1c8,&local_200,
             (StringTree *)0x22a396,(char (*) [8])&scope_local,(StringPtr *)&local_738,
             (StringPtr *)0x22aec0,(char (*) [4])0x229c0c,(char (*) [3])&local_738,
             (StringPtr *)"() = delete;\n\n  class Reader;\n  class Builder;\n  class Pipeline;\n",
             (char (*) [66])&local_238,(StringTree *)&result_3,(Array<kj::StringTree> *)0x22a50e,
             (char (*) [2])&declareText,(StringTree *)0x22a50e,(char (*) [2])0x22b8ff,
             (char (*) [5])in_stack_fffffffffffff808);
  if (fullName.content.size_ != 0) {
    local_790 = (CapnpcCppMain *)fullName.content.ptr;
  }
  sVar27 = fullName.content.size_ + (fullName.content.size_ == 0);
  bVar35 = true;
  if (0xff < proto._reader.dataSize) {
    bVar35 = *(short *)((long)proto._reader.data + 0x1e) == 0;
  }
  pcVar29 = local_738.ptr;
  sVar34 = local_738.size_;
  result_4.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,sVar26,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar31 = result_4.ptr;
  if (sVar26 != 0) {
    psVar24 = firstElement;
    do {
      pcVar4 = (char *)psVar24[1];
      sVar5 = psVar24[2];
      pAVar3 = (ArrayDisposer *)psVar24[3];
      pBVar17 = (Branch *)psVar24[4];
      sVar6 = psVar24[5];
      psVar24[1] = 0;
      psVar24[2] = 0;
      pAVar2 = (ArrayDisposer *)psVar24[6];
      psVar24[4] = 0;
      psVar24[5] = 0;
      pSVar31->size_ = *psVar24;
      (pSVar31->text).content.ptr = pcVar4;
      (pSVar31->text).content.size_ = sVar5;
      (pSVar31->text).content.disposer = pAVar3;
      (pSVar31->branches).ptr = pBVar17;
      (pSVar31->branches).size_ = sVar6;
      (pSVar31->branches).disposer = pAVar2;
      pSVar31 = pSVar31 + 1;
      psVar24 = psVar24 + 0x1c;
    } while (psVar24 != firstElement + lVar25 * 4);
  }
  result_4.size_ = ((long)pSVar31 - (long)result_4.ptr >> 3) * 0x6db6db6db6db6db7;
  result_4.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  result_7.ptr = (StringTree *)local_790;
  local_510._0_8_ = pcVar29;
  local_510._8_8_ = sVar34;
  result_7.size_ = sVar27;
  TemplateContext::allDecls(&brandInitializers.scopes,(TemplateContext *)nestedTypeDecls.size_);
  local_3b8.size_ = 0;
  local_3b8.text.content.ptr = (char *)0x0;
  local_3b8.text.content.size_ = 0;
  type.content.size_ = (size_t)&local_3b8;
  type.content.ptr = (char *)local_510._8_8_;
  makeAsGenericDef((StringTree *)local_7d8,(CapnpcCppMain *)0x0,(AsGenericRole)nestedTypeDecls.size_
                   ,(TemplateContext *)local_510._0_8_,type,in_stack_fffffffffffff808);
  if (bVar35) {
    params_9 = (char (*) [348])0x1679d6;
    kj::StringTree::concat<>();
  }
  else {
    local_468.size_ = 0x22b789;
    local_468.text.content.ptr = (char *)0x1e;
    params_9 = (char (*) [348])0x1679fc;
    kj::StringTree::concat<kj::ArrayPtr<char_const>>((StringTree *)&result_1,&local_468,params);
  }
  kj::
  strTree<kj::StringTree,char_const(&)[7],kj::StringPtr&,char_const(&)[30],kj::StringPtr&,char_const(&)[365],kj::StringTree,kj::StringTree,kj::Array<kj::StringTree>,char_const(&)[348]>
            (&local_378,(kj *)&brandInitializers,(StringTree *)0x22a19c,(char (*) [7])&result_7,
             (StringPtr *)"::Reader {\npublic:\n  typedef ",(char (*) [30])local_510,
             (StringPtr *)
             " Reads;\n\n  Reader() = default;\n  inline explicit Reader(::capnp::_::StructReader base): _reader(base) {}\n\n  inline ::capnp::MessageSize totalSize() const {\n    return _reader.totalSize().asPublic();\n  }\n\n#if !CAPNP_LITE\n  inline ::kj::StringTree toString() const {\n    return ::capnp::_::structString(_reader, *_capnpPrivate::brand());\n  }\n#endif  // !CAPNP_LITE\n\n"
             ,(char (*) [365])local_7d8,(StringTree *)&result_1,(StringTree *)&result_4,
             (Array<kj::StringTree> *)
             "private:\n  ::capnp::_::StructReader _reader;\n  template <typename, ::capnp::Kind>\n  friend struct ::capnp::ToDynamic_;\n  template <typename, ::capnp::Kind>\n  friend struct ::capnp::_::PointerHelpers;\n  template <typename, ::capnp::Kind>\n  friend struct ::capnp::List;\n  friend class ::capnp::MessageBuilder;\n  friend class ::capnp::Orphanage;\n};\n\n"
             ,params_9);
  if (local_768 != (Branch *)0x0) {
    local_768 = (Branch *)0x0;
    pIStack_760 = (Impl *)0x0;
    (**local_758->_vptr_ArrayDisposer)
              (local_758,pBVar9,0x40,pIVar13,pIVar13,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  pIVar13 = pIStack_760;
  pBVar9 = local_768;
  pAVar2 = result_1.content.disposer;
  sVar27 = result_1.content.size_;
  if (result_1.content.size_ != 0) {
    result_1.content.size_ = 0;
    result_1.content.disposer = (ArrayDisposer *)0x0;
    (**pAStack_770->_vptr_ArrayDisposer)(pAStack_770,sVar27,1,pAVar2,pAVar2,0);
  }
  pIVar19 = pIStack_7b0;
  pBVar17 = local_7b8;
  if (local_7b8 != (Branch *)0x0) {
    local_7b8 = (Branch *)0x0;
    pIStack_7b0 = (Impl *)0x0;
    (**local_7a8->_vptr_ArrayDisposer)
              (local_7a8,pBVar17,0x40,pIVar19,pIVar19,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  uVar12 = auStack_7d0._8_8_;
  uVar10 = auStack_7d0._0_8_;
  if ((SegmentReader *)auStack_7d0._0_8_ != (SegmentReader *)0x0) {
    auStack_7d0._0_8_ = (SegmentReader *)0x0;
    auStack_7d0._8_8_ = (StringTree *)0x0;
    (***(_func_int ***)auStack_7d0._16_8_)(auStack_7d0._16_8_,uVar10,1,uVar12,uVar12,0);
  }
  pcVar29 = local_3b8.text.content.ptr;
  sVar27 = local_3b8.size_;
  if (local_3b8.size_ != 0) {
    local_3b8.size_ = 0;
    local_3b8.text.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_3b8.text.content.size_)
              (local_3b8.text.content.size_,sVar27,1,pcVar29,pcVar29,0);
  }
  sVar27 = brandInitializers.scopes.branches.size_;
  pBVar17 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                         (int)brandInitializers.scopes.branches.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                        (int)brandInitializers.scopes.branches.disposer),pBVar17,0x40,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar27 = brandInitializers.scopes.text.content.size_;
  pcVar29 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                         (int)brandInitializers.scopes.text.content.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                        (int)brandInitializers.scopes.text.content.disposer),pcVar29,1,sVar27,sVar27
               ,0);
  }
  pcVar29 = fullName.content.ptr;
  if (fullName.content.size_ == 0) {
    pcVar29 = "";
  }
  sVar27 = fullName.content.size_ + (fullName.content.size_ == 0);
  bVar35 = true;
  if (0xff < proto._reader.dataSize) {
    bVar35 = *(short *)((long)proto._reader.data + 0x1e) == 0;
  }
  pcVar4 = local_738.ptr;
  sVar34 = local_738.size_;
  result_5.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,sVar26,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar31 = result_5.ptr;
  if (sVar26 != 0) {
    lVar30 = 0;
    do {
      psVar24 = (size_t *)((long)firstElement + lVar30 + 0x38);
      sVar5 = *psVar24;
      pcVar7 = (char *)psVar24[1];
      psVar24 = (size_t *)((long)firstElement + lVar30 + 0x48);
      sVar6 = *psVar24;
      pAVar3 = (ArrayDisposer *)psVar24[1];
      pcVar1 = (char *)((long)firstElement + lVar30 + 0x58);
      pBVar17 = *(Branch **)pcVar1;
      sVar8 = *(size_t *)(pcVar1 + 8);
      pcVar1 = (char *)((long)firstElement + lVar30 + 0x40);
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1[8] = '\0';
      pcVar1[9] = '\0';
      pcVar1[10] = '\0';
      pcVar1[0xb] = '\0';
      pcVar1[0xc] = '\0';
      pcVar1[0xd] = '\0';
      pcVar1[0xe] = '\0';
      pcVar1[0xf] = '\0';
      pAVar2 = *(ArrayDisposer **)((long)firstElement + lVar30 + 0x68);
      pcVar1 = (char *)((long)firstElement + lVar30 + 0x58);
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1[8] = '\0';
      pcVar1[9] = '\0';
      pcVar1[10] = '\0';
      pcVar1[0xb] = '\0';
      pcVar1[0xc] = '\0';
      pcVar1[0xd] = '\0';
      pcVar1[0xe] = '\0';
      pcVar1[0xf] = '\0';
      pSVar31->size_ = sVar5;
      (pSVar31->text).content.ptr = pcVar7;
      (pSVar31->text).content.size_ = sVar6;
      (pSVar31->text).content.disposer = pAVar3;
      (pSVar31->branches).ptr = pBVar17;
      (pSVar31->branches).size_ = sVar8;
      (pSVar31->branches).disposer = pAVar2;
      pSVar31 = pSVar31 + 1;
      lVar30 = lVar30 + 0xe0;
    } while (lVar25 * 0x20 - lVar30 != 0);
  }
  result_5.size_ = ((long)pSVar31 - (long)result_5.ptr >> 3) * 0x6db6db6db6db6db7;
  result_5.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_528.ptr = pcVar4;
  local_528.size_ = sVar34;
  local_510._0_8_ = pcVar29;
  local_510._8_8_ = sVar27;
  TemplateContext::allDecls(&brandInitializers.scopes,(TemplateContext *)nestedTypeDecls.size_);
  local_468.size_ = 0;
  local_468.text.content.ptr = (char *)0x0;
  local_468.text.content.size_ = 0;
  type_00.content.size_ = (size_t)&local_468;
  type_00.content.ptr = (char *)local_528.size_;
  makeAsGenericDef((StringTree *)local_7d8,(CapnpcCppMain *)0x1,(AsGenericRole)nestedTypeDecls.size_
                   ,(TemplateContext *)local_528.ptr,type_00,in_stack_fffffffffffff808);
  if (bVar35) {
    kj::StringTree::concat<>();
  }
  else {
    result_7.ptr = (StringTree *)anon_var_dwarf_82a49;
    result_7.size_ = 0x18;
    kj::StringTree::concat<kj::ArrayPtr<char_const>>
              ((StringTree *)&result_1,(StringTree *)&result_7,params_00);
  }
  kj::
  strTree<kj::StringTree,char_const(&)[7],kj::StringPtr&,char_const(&)[31],kj::StringPtr&,char_const(&)[593],kj::StringTree,kj::StringTree,kj::Array<kj::StringTree>,char_const(&)[157],char_const(&)[86]>
            (&local_3b8,(kj *)&brandInitializers,(StringTree *)0x22a19c,(char (*) [7])local_510,
             (StringPtr *)"::Builder {\npublic:\n  typedef ",(char (*) [31])&local_528,
             (StringPtr *)
             " Builds;\n\n  Builder() = delete;  // Deleted to discourage incorrect usage.\n                       // You can explicitly initialize to nullptr instead.\n  inline Builder(decltype(nullptr)) {}\n  inline explicit Builder(::capnp::_::StructBuilder base): _builder(base) {}\n  inline operator Reader() const { return Reader(_builder.asReader()); }\n  inline Reader asReader() const { return *this; }\n\n  inline ::capnp::MessageSize totalSize() const { return asReader().totalSize(); }\n#if !CAPNP_LITE\n  inline ::kj::StringTree toString() const { return asReader().toString(); }\n#endif  // !CAPNP_LITE\n\n"
             ,(char (*) [593])local_7d8,(StringTree *)&result_1,(StringTree *)&result_5,
             (Array<kj::StringTree> *)
             "private:\n  ::capnp::_::StructBuilder _builder;\n  template <typename, ::capnp::Kind>\n  friend struct ::capnp::ToDynamic_;\n  friend class ::capnp::Orphanage;\n"
             ,(char (*) [157])
              "  template <typename, ::capnp::Kind>\n  friend struct ::capnp::_::PointerHelpers;\n};\n\n"
             ,(char (*) [86])in_stack_fffffffffffff808);
  if (local_768 != (Branch *)0x0) {
    local_768 = (Branch *)0x0;
    pIStack_760 = (Impl *)0x0;
    (**local_758->_vptr_ArrayDisposer)
              (local_758,pBVar9,0x40,pIVar13,pIVar13,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  pAVar2 = result_1.content.disposer;
  sVar27 = result_1.content.size_;
  if (result_1.content.size_ != 0) {
    result_1.content.size_ = 0;
    result_1.content.disposer = (ArrayDisposer *)0x0;
    (**pAStack_770->_vptr_ArrayDisposer)(pAStack_770,sVar27,1,pAVar2,pAVar2,0);
  }
  pIVar13 = pIStack_7b0;
  pBVar9 = local_7b8;
  if (local_7b8 != (Branch *)0x0) {
    local_7b8 = (Branch *)0x0;
    pIStack_7b0 = (Impl *)0x0;
    (**local_7a8->_vptr_ArrayDisposer)
              (local_7a8,pBVar9,0x40,pIVar13,pIVar13,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  uVar12 = auStack_7d0._8_8_;
  uVar10 = auStack_7d0._0_8_;
  if ((SegmentReader *)auStack_7d0._0_8_ != (SegmentReader *)0x0) {
    auStack_7d0._0_8_ = (SegmentReader *)0x0;
    auStack_7d0._8_8_ = (StringTree *)0x0;
    (***(_func_int ***)auStack_7d0._16_8_)(auStack_7d0._16_8_,uVar10,1,uVar12,uVar12,0);
  }
  pcVar29 = local_468.text.content.ptr;
  sVar27 = local_468.size_;
  if (local_468.size_ != 0) {
    local_468.size_ = 0;
    local_468.text.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_468.text.content.size_)
              (local_468.text.content.size_,sVar27,1,pcVar29,pcVar29,0);
  }
  sVar27 = brandInitializers.scopes.branches.size_;
  pBVar9 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                         (int)brandInitializers.scopes.branches.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                        (int)brandInitializers.scopes.branches.disposer),pBVar9,0x40,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar27 = brandInitializers.scopes.text.content.size_;
  pcVar29 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                         (int)brandInitializers.scopes.text.content.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                        (int)brandInitializers.scopes.text.content.disposer),pcVar29,1,sVar27,sVar27
               ,0);
  }
  pcVar29 = fullName.content.ptr;
  if (fullName.content.size_ == 0) {
    pcVar29 = "";
  }
  sVar34 = fullName.content.size_ + (fullName.content.size_ == 0);
  pcVar4 = local_738.ptr;
  sVar27 = local_738.size_;
  result_6.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,sVar26,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar31 = result_6.ptr;
  if (sVar26 != 0) {
    lVar30 = 0;
    do {
      psVar24 = (size_t *)((long)firstElement + lVar30 + 0x70);
      sVar5 = *psVar24;
      pcVar7 = (char *)psVar24[1];
      psVar24 = (size_t *)((long)firstElement + lVar30 + 0x80);
      sVar6 = *psVar24;
      pAVar3 = (ArrayDisposer *)psVar24[1];
      pcVar1 = (char *)((long)firstElement + lVar30 + 0x90);
      pBVar9 = *(Branch **)pcVar1;
      sVar8 = *(size_t *)(pcVar1 + 8);
      pcVar1 = (char *)((long)firstElement + lVar30 + 0x78);
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1[8] = '\0';
      pcVar1[9] = '\0';
      pcVar1[10] = '\0';
      pcVar1[0xb] = '\0';
      pcVar1[0xc] = '\0';
      pcVar1[0xd] = '\0';
      pcVar1[0xe] = '\0';
      pcVar1[0xf] = '\0';
      pAVar2 = *(ArrayDisposer **)((long)firstElement + lVar30 + 0xa0);
      pcVar1 = (char *)((long)firstElement + lVar30 + 0x90);
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1[8] = '\0';
      pcVar1[9] = '\0';
      pcVar1[10] = '\0';
      pcVar1[0xb] = '\0';
      pcVar1[0xc] = '\0';
      pcVar1[0xd] = '\0';
      pcVar1[0xe] = '\0';
      pcVar1[0xf] = '\0';
      pSVar31->size_ = sVar5;
      (pSVar31->text).content.ptr = pcVar7;
      (pSVar31->text).content.size_ = sVar6;
      (pSVar31->text).content.disposer = pAVar3;
      (pSVar31->branches).ptr = pBVar9;
      (pSVar31->branches).size_ = sVar8;
      (pSVar31->branches).disposer = pAVar2;
      pSVar31 = pSVar31 + 1;
      lVar30 = lVar30 + 0xe0;
    } while (lVar25 * 0x20 - lVar30 != 0);
  }
  result_6.size_ = ((long)pSVar31 - (long)result_6.ptr >> 3) * 0x6db6db6db6db6db7;
  result_6.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_468.size_ = (size_t)pcVar4;
  local_468.text.content.ptr = (char *)sVar27;
  result_1.content.ptr = pcVar29;
  result_1.content.size_ = sVar34;
  TemplateContext::allDecls(&brandInitializers.scopes,(TemplateContext *)nestedTypeDecls.size_);
  pSVar31 = (StringTree *)&result_1;
  kj::
  strTree<char_const(&)[17],kj::StringTree,char_const(&)[7],kj::StringPtr&,char_const(&)[32],kj::StringPtr&,char_const(&)[183],kj::Array<kj::StringTree>,char_const(&)[192]>
            ((StringTree *)local_7d8,(kj *)0x229c8c,(char (*) [17])&brandInitializers,
             (StringTree *)0x22a19c,(char (*) [7])pSVar31,
             (StringPtr *)"::Pipeline {\npublic:\n  typedef ",(char (*) [32])&local_468,
             (StringPtr *)
             " Pipelines;\n\n  inline Pipeline(decltype(nullptr)): _typeless(nullptr) {}\n  inline explicit Pipeline(::capnp::AnyPointer::Pipeline&& typeless)\n      : _typeless(kj::mv(typeless)) {}\n\n"
             ,(char (*) [183])&result_6,
             (Array<kj::StringTree> *)
             "private:\n  ::capnp::AnyPointer::Pipeline _typeless;\n  friend class ::capnp::PipelineHook;\n  template <typename, ::capnp::Kind>\n  friend struct ::capnp::ToDynamic_;\n};\n#endif  // !CAPNP_LITE\n\n"
             ,(char (*) [192])in_stack_fffffffffffff808);
  pSVar33 = (StringTree *)brandInitializers.scopes.branches.size_;
  pBVar9 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                         (int)brandInitializers.scopes.branches.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                        (int)brandInitializers.scopes.branches.disposer),pBVar9,0x40,pSVar33,pSVar33
               ,kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pSVar31 = pSVar33;
  }
  pSVar33 = (StringTree *)brandInitializers.scopes.text.content.size_;
  pcVar29 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                         (int)brandInitializers.scopes.text.content.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                        (int)brandInitializers.scopes.text.content.disposer),pcVar29,1,pSVar33,
               pSVar33,0);
    pSVar31 = pSVar33;
  }
  pSVar33 = &__return_storage_ptr__->readerBuilderDefs;
  kj::StringTree::concat<kj::StringTree,kj::StringTree,kj::StringTree>
            (pSVar33,&local_378,&local_3b8,(StringTree *)local_7d8,pSVar31);
  if (proto._reader.dataSize < 0x100) {
    bVar35 = false;
  }
  else {
    bVar35 = *(short *)((long)proto._reader.data + 0x1e) != 0;
  }
  local_790 = (CapnpcCppMain *)pSVar33;
  if (bVar35) {
    TemplateContext::allDecls((StringTree *)&result_1,(TemplateContext *)nestedTypeDecls.size_);
    TemplateContext::allDecls(&local_468,(TemplateContext *)nestedTypeDecls.size_);
    local_2b8._16_8_ = "inline ";
    local_2a0 = 7;
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&result_7,(kj *)&whichName,value);
    local_2b8._0_8_ = " ";
    local_2b8._8_8_ = 1;
    local_2c8.size_ = 0;
    if (fullName.content.size_ != 0) {
      local_2c8.size_ = fullName.content.size_ - 1;
    }
    local_2d8.ptr =
         "::Reader::which() const {\n  return _reader.getDataField<Which>(\n      ::capnp::bounded<"
    ;
    local_2d8.size_ = 0x57;
    kj::_::Stringifier::operator*((CappedArray<char,_14UL> *)local_510,(Stringifier *)&kj::_::STR,i)
    ;
    local_2e8._0_8_ = ">() * ::capnp::ELEMENTS);\n}\n";
    local_2e8[8] = '\x1c';
    local_2e8[9] = '\0';
    local_2e8[10] = '\0';
    local_2e8[0xb] = '\0';
    local_2e8[0xc] = '\0';
    local_2e8[0xd] = '\0';
    local_2e8[0xe] = '\0';
    local_2e8[0xf] = '\0';
    local_308._16_8_ = "inline ";
    local_2f0 = 7;
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&local_528,(kj *)&whichName,value_00);
    local_308._0_8_ = " ";
    local_308._8_8_ = 1;
    local_318.size_ = 0;
    if (fullName.content.size_ != 0) {
      local_318.size_ = fullName.content.size_ - 1;
    }
    local_328.ptr =
         "::Builder::which() {\n  return _builder.getDataField<Which>(\n      ::capnp::bounded<";
    local_328.size_ = 0x53;
    pAVar37 = (ArrayPtr<const_char> *)0x16833f;
    kj::_::Stringifier::operator*
              ((CappedArray<char,_14UL> *)(local_108 + 0x10),(Stringifier *)&kj::_::STR,i);
    local_108._0_8_ = ">() * ::capnp::ELEMENTS);\n}\n\n";
    local_108[8] = '\x1d';
    local_108[9] = '\0';
    local_108[10] = '\0';
    local_108[0xb] = '\0';
    local_108[0xc] = '\0';
    local_108[0xd] = '\0';
    local_108[0xe] = '\0';
    local_108[0xf] = '\0';
    kj::StringTree::
    concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
              (&brandInitializers.scopes,(StringTree *)&result_1,(StringTree *)(local_2b8 + 0x10),
               (ArrayPtr<const_char> *)&result_7,(String *)local_2b8,&local_2c8,&local_2d8,
               (ArrayPtr<const_char> *)local_510,(CappedArray<char,_14UL> *)local_2e8,
               (ArrayPtr<const_char> *)&local_468,(StringTree *)(local_308 + 0x10),&local_528,
               (String *)local_308,&local_318,&local_328,(ArrayPtr<const_char> *)(local_108 + 0x10),
               (CappedArray<char,_14UL> *)local_108,pAVar37);
    sVar27 = local_528.size_;
    pcVar29 = local_528.ptr;
    if ((TemplateContext *)local_528.ptr != (TemplateContext *)0x0) {
      local_528.ptr = (char *)0x0;
      local_528.size_ = 0;
      (**(code **)*local_518)(local_518,pcVar29,1,sVar27,sVar27,0);
    }
    sVar27 = result_7.size_;
    pSVar31 = result_7.ptr;
    if (result_7.ptr != (StringTree *)0x0) {
      result_7.ptr = (StringTree *)0x0;
      result_7.size_ = 0;
      (**(result_7.disposer)->_vptr_ArrayDisposer)(result_7.disposer,pSVar31,1,sVar27,sVar27,0);
    }
  }
  else {
    kj::StringTree::concat<>();
  }
  result_7.ptr = (StringTree *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,sVar26,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar31 = result_7.ptr;
  if (sVar26 != 0) {
    lVar30 = 0;
    do {
      psVar24 = (size_t *)((long)firstElement + lVar30 + 0xa8);
      sVar27 = *psVar24;
      pcVar4 = (char *)psVar24[1];
      psVar24 = (size_t *)((long)firstElement + lVar30 + 0xb8);
      sVar34 = *psVar24;
      pAVar3 = (ArrayDisposer *)psVar24[1];
      pcVar29 = (char *)((long)firstElement + lVar30 + 200);
      pBVar9 = *(Branch **)pcVar29;
      sVar5 = *(size_t *)(pcVar29 + 8);
      pcVar29 = (char *)((long)firstElement + lVar30 + 0xb0);
      pcVar29[0] = '\0';
      pcVar29[1] = '\0';
      pcVar29[2] = '\0';
      pcVar29[3] = '\0';
      pcVar29[4] = '\0';
      pcVar29[5] = '\0';
      pcVar29[6] = '\0';
      pcVar29[7] = '\0';
      pcVar29[8] = '\0';
      pcVar29[9] = '\0';
      pcVar29[10] = '\0';
      pcVar29[0xb] = '\0';
      pcVar29[0xc] = '\0';
      pcVar29[0xd] = '\0';
      pcVar29[0xe] = '\0';
      pcVar29[0xf] = '\0';
      pAVar2 = *(ArrayDisposer **)((long)firstElement + lVar30 + 0xd8);
      pcVar29 = (char *)((long)firstElement + lVar30 + 200);
      pcVar29[0] = '\0';
      pcVar29[1] = '\0';
      pcVar29[2] = '\0';
      pcVar29[3] = '\0';
      pcVar29[4] = '\0';
      pcVar29[5] = '\0';
      pcVar29[6] = '\0';
      pcVar29[7] = '\0';
      pcVar29[8] = '\0';
      pcVar29[9] = '\0';
      pcVar29[10] = '\0';
      pcVar29[0xb] = '\0';
      pcVar29[0xc] = '\0';
      pcVar29[0xd] = '\0';
      pcVar29[0xe] = '\0';
      pcVar29[0xf] = '\0';
      pSVar31->size_ = sVar27;
      (pSVar31->text).content.ptr = pcVar4;
      (pSVar31->text).content.size_ = sVar34;
      (pSVar31->text).content.disposer = pAVar3;
      (pSVar31->branches).ptr = pBVar9;
      (pSVar31->branches).size_ = sVar5;
      (pSVar31->branches).disposer = pAVar2;
      pSVar31 = pSVar31 + 1;
      lVar30 = lVar30 + 0xe0;
    } while (lVar25 * 0x20 - lVar30 != 0);
  }
  result_7.size_ = ((long)pSVar31 - (long)result_7.ptr >> 3) * 0x6db6db6db6db6db7;
  result_7.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  kj::strTree<kj::StringTree,kj::Array<kj::StringTree>>
            (&__return_storage_ptr__->inlineMethodDefs,(kj *)&brandInitializers,
             (StringTree *)&result_7,(Array<kj::StringTree> *)result_7.size_);
  sVar27 = result_7.size_;
  pSVar31 = result_7.ptr;
  (__return_storage_ptr__->sourceDefs).size_ = defineText.size_;
  (__return_storage_ptr__->sourceDefs).text.content.ptr = defineText.text.content.ptr;
  (__return_storage_ptr__->sourceDefs).text.content.size_ = defineText.text.content.size_;
  (__return_storage_ptr__->sourceDefs).text.content.disposer =
       (ArrayDisposer *)
       CONCAT44(defineText.text.content.disposer._4_4_,(int)defineText.text.content.disposer);
  defineText.text.content.ptr = (char *)0x0;
  defineText.text.content.size_ = 0;
  (__return_storage_ptr__->sourceDefs).branches.ptr = defineText.branches.ptr;
  (__return_storage_ptr__->sourceDefs).branches.size_ = defineText.branches.size_;
  (__return_storage_ptr__->sourceDefs).branches.disposer = defineText.branches.disposer;
  defineText.branches.ptr = (Branch *)0x0;
  defineText.branches.size_ = 0;
  if (result_7.ptr != (StringTree *)0x0) {
    result_7.ptr = (StringTree *)0x0;
    result_7.size_ = 0;
    (**(result_7.disposer)->_vptr_ArrayDisposer)
              (result_7.disposer,pSVar31,0x38,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  sVar27 = brandInitializers.scopes.branches.size_;
  pBVar9 = brandInitializers.scopes.branches.ptr;
  if (brandInitializers.scopes.branches.ptr != (Branch *)0x0) {
    brandInitializers.scopes.branches.ptr = (Branch *)0x0;
    brandInitializers.scopes.branches.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                         (int)brandInitializers.scopes.branches.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.branches.disposer._4_4_,
                        (int)brandInitializers.scopes.branches.disposer),pBVar9,0x40,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar27 = brandInitializers.scopes.text.content.size_;
  pcVar29 = brandInitializers.scopes.text.content.ptr;
  if (brandInitializers.scopes.text.content.ptr != (char *)0x0) {
    brandInitializers.scopes.text.content.ptr = (char *)0x0;
    brandInitializers.scopes.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                         (int)brandInitializers.scopes.text.content.disposer))
              ((undefined8 *)
               CONCAT44(brandInitializers.scopes.text.content.disposer._4_4_,
                        (int)brandInitializers.scopes.text.content.disposer),pcVar29,1,sVar27,sVar27
               ,0);
  }
  sVar27 = local_468.branches.size_;
  pBVar9 = local_468.branches.ptr;
  if (bVar35) {
    if (local_468.branches.ptr != (Branch *)0x0) {
      local_468.branches.ptr = (Branch *)0x0;
      local_468.branches.size_ = 0;
      (**(local_468.branches.disposer)->_vptr_ArrayDisposer)
                (local_468.branches.disposer,pBVar9,0x40,sVar27,sVar27,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    sVar27 = local_468.text.content.size_;
    pcVar29 = local_468.text.content.ptr;
    if (local_468.text.content.ptr != (char *)0x0) {
      local_468.text.content.ptr = (char *)0x0;
      local_468.text.content.size_ = 0;
      (**(local_468.text.content.disposer)->_vptr_ArrayDisposer)
                (local_468.text.content.disposer,pcVar29,1,sVar27,sVar27,0);
    }
    if (local_768 != (Branch *)0x0) {
      (**local_758->_vptr_ArrayDisposer)
                (local_758,local_768,0x40,pIStack_760,pIStack_760,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    pAVar2 = result_1.content.disposer;
    sVar27 = result_1.content.size_;
    if (result_1.content.size_ != 0) {
      result_1.content.size_ = 0;
      result_1.content.disposer = (ArrayDisposer *)0x0;
      (**pAStack_770->_vptr_ArrayDisposer)(pAStack_770,sVar27,1,pAVar2,pAVar2,0);
    }
  }
  pIVar13 = pIStack_7b0;
  pBVar9 = local_7b8;
  if (local_7b8 != (Branch *)0x0) {
    local_7b8 = (Branch *)0x0;
    pIStack_7b0 = (Impl *)0x0;
    (**local_7a8->_vptr_ArrayDisposer)
              (local_7a8,pBVar9,0x40,pIVar13,pIVar13,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  uVar12 = auStack_7d0._8_8_;
  uVar10 = auStack_7d0._0_8_;
  if ((SegmentReader *)auStack_7d0._0_8_ != (SegmentReader *)0x0) {
    auStack_7d0._0_8_ = (SegmentReader *)0x0;
    auStack_7d0._8_8_ = (StringTree *)0x0;
    (***(_func_int ***)auStack_7d0._16_8_)(auStack_7d0._16_8_,uVar10,1,uVar12,uVar12,0);
  }
  sVar27 = result_6.size_;
  pSVar31 = result_6.ptr;
  if (result_6.ptr != (StringTree *)0x0) {
    result_6.ptr = (StringTree *)0x0;
    result_6.size_ = 0;
    (**(result_6.disposer)->_vptr_ArrayDisposer)
              (result_6.disposer,pSVar31,0x38,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  sVar27 = local_3b8.branches.size_;
  pBVar9 = local_3b8.branches.ptr;
  if (local_3b8.branches.ptr != (Branch *)0x0) {
    local_3b8.branches.ptr = (Branch *)0x0;
    local_3b8.branches.size_ = 0;
    (**(local_3b8.branches.disposer)->_vptr_ArrayDisposer)
              (local_3b8.branches.disposer,pBVar9,0x40,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar27 = local_3b8.text.content.size_;
  pcVar29 = local_3b8.text.content.ptr;
  if (local_3b8.text.content.ptr != (char *)0x0) {
    local_3b8.text.content.ptr = (char *)0x0;
    local_3b8.text.content.size_ = 0;
    (**(local_3b8.text.content.disposer)->_vptr_ArrayDisposer)
              (local_3b8.text.content.disposer,pcVar29,1,sVar27,sVar27,0);
  }
  sVar27 = result_5.size_;
  pSVar31 = result_5.ptr;
  if (result_5.ptr != (StringTree *)0x0) {
    result_5.ptr = (StringTree *)0x0;
    result_5.size_ = 0;
    (**(result_5.disposer)->_vptr_ArrayDisposer)
              (result_5.disposer,pSVar31,0x38,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  sVar27 = local_378.branches.size_;
  pBVar9 = local_378.branches.ptr;
  if (local_378.branches.ptr != (Branch *)0x0) {
    local_378.branches.ptr = (Branch *)0x0;
    local_378.branches.size_ = 0;
    (**(local_378.branches.disposer)->_vptr_ArrayDisposer)
              (local_378.branches.disposer,pBVar9,0x40,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar27 = local_378.text.content.size_;
  pcVar29 = local_378.text.content.ptr;
  if ((char (*) [6])local_378.text.content.ptr != (char (*) [6])0x0) {
    local_378.text.content.ptr = (char *)0x0;
    local_378.text.content.size_ = 0;
    (**(local_378.text.content.disposer)->_vptr_ArrayDisposer)
              (local_378.text.content.disposer,pcVar29,1,sVar27,sVar27,0);
  }
  sVar27 = result_4.size_;
  pSVar31 = result_4.ptr;
  if (result_4.ptr != (StringTree *)0x0) {
    result_4.ptr = (StringTree *)0x0;
    result_4.size_ = 0;
    (**(result_4.disposer)->_vptr_ArrayDisposer)
              (result_4.disposer,pSVar31,0x38,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  sVar27 = result_3.size_;
  pSVar31 = result_3.ptr;
  if (result_3.ptr != (StringTree *)0x0) {
    result_3.ptr = (StringTree *)0x0;
    result_3.size_ = 0;
    (**(result_3.disposer)->_vptr_ArrayDisposer)
              (result_3.disposer,pSVar31,0x38,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  sVar27 = local_238.branches.size_;
  pBVar9 = local_238.branches.ptr;
  if (local_238.branches.ptr != (Branch *)0x0) {
    local_238.branches.ptr = (Branch *)0x0;
    local_238.branches.size_ = 0;
    (**(local_238.branches.disposer)->_vptr_ArrayDisposer)
              (local_238.branches.disposer,pBVar9,0x40,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar27 = local_238.text.content.size_;
  pcVar29 = local_238.text.content.ptr;
  if (local_238.text.content.ptr != (char *)0x0) {
    local_238.text.content.ptr = (char *)0x0;
    local_238.text.content.size_ = 0;
    (**(local_238.text.content.disposer)->_vptr_ArrayDisposer)
              (local_238.text.content.disposer,pcVar29,1,sVar27,sVar27,0);
  }
  sVar27 = result_2.size_;
  pSVar31 = result_2.ptr;
  if ((bVar14) && (result_2.ptr != (StringTree *)0x0)) {
    result_2.ptr = (StringTree *)0x0;
    result_2.size_ = 0;
    (**(result_2.disposer)->_vptr_ArrayDisposer)
              (result_2.disposer,pSVar31,0x38,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  sVar27 = local_200.branches.size_;
  pBVar9 = local_200.branches.ptr;
  if (local_200.branches.ptr != (Branch *)0x0) {
    local_200.branches.ptr = (Branch *)0x0;
    local_200.branches.size_ = 0;
    (**(local_200.branches.disposer)->_vptr_ArrayDisposer)
              (local_200.branches.disposer,pBVar9,0x40,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar27 = local_200.text.content.size_;
  pcVar29 = local_200.text.content.ptr;
  if (local_200.text.content.ptr != (char *)0x0) {
    local_200.text.content.ptr = (char *)0x0;
    local_200.text.content.size_ = 0;
    (**(local_200.text.content.disposer)->_vptr_ArrayDisposer)
              (local_200.text.content.disposer,pcVar29,1,sVar27,sVar27,0);
  }
  sVar27 = local_1c8.branches.size_;
  pBVar9 = local_1c8.branches.ptr;
  if (local_1c8.branches.ptr != (Branch *)0x0) {
    local_1c8.branches.ptr = (Branch *)0x0;
    local_1c8.branches.size_ = 0;
    (**(local_1c8.branches.disposer)->_vptr_ArrayDisposer)
              (local_1c8.branches.disposer,pBVar9,0x40,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar27 = local_1c8.text.content.size_;
  pcVar29 = local_1c8.text.content.ptr;
  if (local_1c8.text.content.ptr != (char *)0x0) {
    local_1c8.text.content.ptr = (char *)0x0;
    local_1c8.text.content.size_ = 0;
    (**(local_1c8.text.content.disposer)->_vptr_ArrayDisposer)
              (local_1c8.text.content.disposer,pcVar29,1,sVar27,sVar27,0);
  }
  sVar27 = local_190.branches.size_;
  pBVar9 = local_190.branches.ptr;
  if (local_190.branches.ptr != (Branch *)0x0) {
    local_190.branches.ptr = (Branch *)0x0;
    local_190.branches.size_ = 0;
    (**(local_190.branches.disposer)->_vptr_ArrayDisposer)
              (local_190.branches.disposer,pBVar9,0x40,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar27 = local_190.text.content.size_;
  pcVar29 = local_190.text.content.ptr;
  if (local_190.text.content.ptr != (char *)0x0) {
    local_190.text.content.ptr = (char *)0x0;
    local_190.text.content.size_ = 0;
    (**(local_190.text.content.disposer)->_vptr_ArrayDisposer)
              (local_190.text.content.disposer,pcVar29,1,sVar27,sVar27,0);
  }
  pBVar9 = whichName.name.branches.ptr;
  if (whichName.name.branches.ptr != (Branch *)0x0) {
    uVar10 = CONCAT44(whichName.name.branches.size_._4_4_,(undefined4)whichName.name.branches.size_)
    ;
    whichName.name.branches.ptr = (Branch *)0x0;
    whichName.name.branches.size_._0_4_ = 0;
    whichName.name.branches.size_._4_4_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(whichName.name.branches.disposer._4_4_,
                         whichName.name.branches.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(whichName.name.branches.disposer._4_4_,
                        whichName.name.branches.disposer._0_4_),pBVar9,0x40,uVar10,uVar10,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar27 = whichName.name.text.content.size_;
  pcVar29 = whichName.name.text.content.ptr;
  if (whichName.name.text.content.ptr != (char *)0x0) {
    whichName.name.text.content.ptr = (char *)0x0;
    whichName.name.text.content.size_ = 0;
    (**(whichName.name.text.content.disposer)->_vptr_ArrayDisposer)
              (whichName.name.text.content.disposer,pcVar29,1,sVar27,sVar27,0);
  }
  sVar27 = defineText.branches.size_;
  pBVar9 = defineText.branches.ptr;
  if (defineText.branches.ptr != (Branch *)0x0) {
    defineText.branches.ptr = (Branch *)0x0;
    defineText.branches.size_ = 0;
    (**(defineText.branches.disposer)->_vptr_ArrayDisposer)
              (defineText.branches.disposer,pBVar9,0x40,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar27 = defineText.text.content.size_;
  pcVar29 = defineText.text.content.ptr;
  if (defineText.text.content.ptr != (char *)0x0) {
    defineText.text.content.ptr = (char *)0x0;
    defineText.text.content.size_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(defineText.text.content.disposer._4_4_,
                         (int)defineText.text.content.disposer))
              ((undefined8 *)
               CONCAT44(defineText.text.content.disposer._4_4_,(int)defineText.text.content.disposer
                       ),pcVar29,1,sVar27,sVar27,0);
  }
  sVar27 = declareText.branches.size_;
  pBVar9 = declareText.branches.ptr;
  if (declareText.branches.ptr != (Branch *)0x0) {
    declareText.branches.ptr = (Branch *)0x0;
    declareText.branches.size_ = 0;
    (**(declareText.branches.disposer)->_vptr_ArrayDisposer)
              (declareText.branches.disposer,pBVar9,0x40,sVar27,sVar27,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar27 = declareText.text.content.size_;
  pcVar29 = declareText.text.content.ptr;
  if (declareText.text.content.ptr != (char *)0x0) {
    declareText.text.content.ptr = (char *)0x0;
    declareText.text.content.size_ = 0;
    (**(declareText.text.content.disposer)->_vptr_ArrayDisposer)
              (declareText.text.content.disposer,pcVar29,1,sVar27,sVar27,0);
  }
  sVar27 = templates.content.size_;
  pcVar29 = templates.content.ptr;
  if (templates.content.ptr != (char *)0x0) {
    templates.content.ptr = (char *)0x0;
    templates.content.size_ = 0;
    (**(templates.content.disposer)->_vptr_ArrayDisposer)
              (templates.content.disposer,pcVar29,1,sVar27,sVar27,0);
  }
  if (firstElement != (size_t *)0x0) {
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement,0xe0,sVar26,
               sVar26,kj::ArrayDisposer::
                      Dispose_<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText,_false>::
                      destruct);
  }
  sVar26 = subScope.content.size_;
  pcVar29 = subScope.content.ptr;
  if (subScope.content.ptr != (char *)0x0) {
    subScope.content.ptr = (char *)0x0;
    subScope.content.size_ = 0;
    (**(subScope.content.disposer)->_vptr_ArrayDisposer)
              (subScope.content.disposer,pcVar29,1,sVar26,sVar26,0);
  }
  sVar26 = fullName.content.size_;
  pcVar29 = fullName.content.ptr;
  if (fullName.content.ptr != (char *)0x0) {
    fullName.content.ptr = (char *)0x0;
    fullName.content.size_ = 0;
    (**(fullName.content.disposer)->_vptr_ArrayDisposer)
              (fullName.content.disposer,pcVar29,1,sVar26,sVar26,0);
  }
  return __return_storage_ptr__;
}

Assistant:

StructText makeStructText(kj::StringPtr scope, kj::StringPtr name, StructSchema schema,
                            kj::Array<kj::StringTree> nestedTypeDecls,
                            const TemplateContext& templateContext) {
    auto proto = schema.getProto();
    KJ_IF_MAYBE(annotatedName, annotationValue(proto, NAME_ANNOTATION_ID)) {
      name = annotatedName->getText();
    }
    auto fullName = kj::str(scope, name, templateContext.args());
    auto subScope = kj::str(fullName, "::");
    auto fieldTexts = KJ_MAP(f, schema.getFields()) {
      return makeFieldText(subScope, f, templateContext);
    };

    auto structNode = proto.getStruct();
    uint discrimOffset = structNode.getDiscriminantOffset();
    auto hexId = kj::hex(proto.getId());

    kj::String templates = kj::str(templateContext.allDecls());  // Ends with a newline

    // Private members struct
    kj::StringTree declareText = kj::strTree(
         "  struct _capnpPrivate {\n"
         "    CAPNP_DECLARE_STRUCT_HEADER(", hexId, ", ", structNode.getDataWordCount(), ", ",
         structNode.getPointerCount(), ")\n");

    kj::StringTree defineText = kj::strTree(
        "// ", fullName, "\n",
        templates, "constexpr uint16_t ", fullName, "::_capnpPrivate::dataWordSize;\n",
        templates, "constexpr uint16_t ", fullName, "::_capnpPrivate::pointerCount;\n"
        "#if !CAPNP_LITE\n",
        templates, "constexpr ::capnp::Kind ", fullName, "::_capnpPrivate::kind;\n",
        templates, "constexpr ::capnp::_::RawSchema const* ", fullName, "::_capnpPrivate::schema;\n");

    if (templateContext.isGeneric()) {
      auto brandInitializers = makeBrandInitializers(templateContext, schema);
      bool hasDeps = (brandInitializers.dependencies.size() != 0);

      declareText = kj::strTree(kj::mv(declareText),
          "    #if !CAPNP_LITE\n",
          makeGenericDeclarations(templateContext, hasDeps),
          "    #endif  // !CAPNP_LITE\n");

      defineText = kj::strTree(kj::mv(defineText),
          makeGenericDefinitions(
              templateContext, fullName, kj::str(hexId), kj::mv(brandInitializers)));
    } else {
      declareText = kj::strTree(kj::mv(declareText),
          "    #if !CAPNP_LITE\n"
          "    static constexpr ::capnp::_::RawBrandedSchema const* brand() { return &schema->defaultBrand; }\n"
          "    #endif  // !CAPNP_LITE\n");
    }

    declareText = kj::strTree(kj::mv(declareText), "  };");
    defineText = kj::strTree(kj::mv(defineText), "#endif  // !CAPNP_LITE\n\n");

    // Name of the ::Which type, when applicable.
    CppTypeName whichName;
    if (structNode.getDiscriminantCount() != 0) {
      whichName = cppFullName(schema, nullptr);
      whichName.addMemberType("Which");
    }

    return StructText {
      kj::strTree(
          templateContext.hasParams() ? "  " : "", templateContext.decl(true),
          "  struct ", name, ";\n"),

      kj::strTree(
          templateContext.parentDecls(),
          templateContext.decl(scope == nullptr),
          "struct ", scope, name, " {\n",
          "  ", name, "() = delete;\n"
          "\n"
          "  class Reader;\n"
          "  class Builder;\n"
          "  class Pipeline;\n",
          structNode.getDiscriminantCount() == 0 ? kj::strTree() : kj::strTree(
              "  enum Which: uint16_t {\n",
              KJ_MAP(f, structNode.getFields()) {
                if (hasDiscriminantValue(f)) {
                  return kj::strTree("    ", toUpperCase(protoName(f)), ",\n");
                } else {
                  return kj::strTree();
                }
              },
              "  };\n"),
          KJ_MAP(n, nestedTypeDecls) { return kj::mv(n); },
          "\n",
          kj::mv(declareText), "\n",
          "};\n"
          "\n"),

      kj::strTree(
          makeReaderDef(fullName, name, templateContext, structNode.getDiscriminantCount() != 0,
                        KJ_MAP(f, fieldTexts) { return kj::mv(f.readerMethodDecls); }),
          makeBuilderDef(fullName, name, templateContext, structNode.getDiscriminantCount() != 0,
                         KJ_MAP(f, fieldTexts) { return kj::mv(f.builderMethodDecls); }),
          makePipelineDef(fullName, name, templateContext, structNode.getDiscriminantCount() != 0,
                          KJ_MAP(f, fieldTexts) { return kj::mv(f.pipelineMethodDecls); })),

      kj::strTree(
          structNode.getDiscriminantCount() == 0 ? kj::strTree() : kj::strTree(
              templateContext.allDecls(),
              "inline ", whichName, " ", fullName, "::Reader::which() const {\n"
              "  return _reader.getDataField<Which>(\n"
              "      ::capnp::bounded<", discrimOffset, ">() * ::capnp::ELEMENTS);\n"
              "}\n",
              templateContext.allDecls(),
              "inline ", whichName, " ", fullName, "::Builder::which() {\n"
              "  return _builder.getDataField<Which>(\n"
              "      ::capnp::bounded<", discrimOffset, ">() * ::capnp::ELEMENTS);\n"
              "}\n"
              "\n"),
          KJ_MAP(f, fieldTexts) { return kj::mv(f.inlineMethodDefs); }),

      kj::mv(defineText)
    };
  }